

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O0

void __thiscall duckdb::VacuumGlobalSinkState::~VacuumGlobalSinkState(VacuumGlobalSinkState *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__VacuumGlobalSinkState_0352c0a8;
  vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_true>
             *)0x17faf6d);
  GlobalSinkState::~GlobalSinkState((GlobalSinkState *)0x17faf77);
  return;
}

Assistant:

explicit VacuumGlobalSinkState(VacuumInfo &info, optional_ptr<TableCatalogEntry> table) {
		for (const auto &column_name : info.columns) {
			auto &column = table->GetColumn(column_name);
			if (DistinctStatistics::TypeIsSupported(column.GetType())) {
				column_distinct_stats.push_back(make_uniq<DistinctStatistics>());
			} else {
				column_distinct_stats.push_back(nullptr);
			}
		}
	}